

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Decompose_Cholesky
          (TPZMatrix<Fad<double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t k;
  long lVar4;
  long lVar5;
  long local_140;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_138;
  Fad<double> tmp2;
  undefined1 local_f8 [32];
  Fad<double> local_d8;
  double local_b8;
  undefined8 uStack_b0;
  list<long,_std::allocator<long>_> *local_a8;
  Fad<double> tmp;
  undefined1 local_80 [16];
  Fad<double> local_70;
  Fad<double> local_50;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  local_a8 = singular;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_140 = 0;
    while( true ) {
      if (CONCAT44(extraout_var,iVar3) <= local_140) break;
      for (lVar4 = 0; lVar5 = local_140, lVar4 < local_140; lVar4 = lVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp,this,local_140,local_140);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_70,this,local_140,lVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_d8,this,local_140,lVar4);
        local_f8._8_8_ = &local_138;
        local_138.fadexpr_.left_ = &local_70;
        local_138.fadexpr_.right_ = &local_d8;
        local_f8._0_8_ = &tmp;
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (&tmp2,(FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                          *)local_f8);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar5,&tmp2);
        Fad<double>::~Fad(&tmp2);
        Fad<double>::~Fad(&local_d8);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad(&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&tmp2,this,local_140,local_140);
      local_b8 = ABS(tmp2.val_);
      uStack_b0 = 0;
      tmp.val_ = 1e-12;
      tmp.dx_.num_elts = 0;
      tmp.dx_.ptr_to_data = (double *)0x0;
      tmp.defaultVal = 0.0;
      Fad<double>::~Fad(&tmp);
      Fad<double>::~Fad(&tmp2);
      if (local_b8 <= 1e-12) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(local_a8,&local_140);
        tmp2.val_ = 1.0;
        tmp2.dx_.num_elts = 0;
        tmp2.dx_.ptr_to_data = (double *)0x0;
        tmp2.defaultVal = 0.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_140,local_140,&tmp2);
        Fad<double>::~Fad(&tmp2);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_70,this,local_140);
      sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&tmp2,&local_70);
      Fad<double>::Fad<FadFuncSqrt<Fad<double>>>(&tmp,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)&tmp2);
      Fad<double>::~Fad((Fad<double> *)&tmp2.dx_);
      Fad<double>::~Fad(&local_70);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_140,local_140,&tmp);
      lVar4 = local_140;
      while( true ) {
        lVar4 = lVar4 + 1;
        if (CONCAT44(extraout_var,iVar3) <= lVar4) break;
        for (lVar5 = 0; lVar1 = local_140, lVar5 < local_140; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_70,this,local_140,lVar4);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_d8,this,local_140,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_f8,this,lVar5,lVar4);
          local_80._0_8_ = &local_d8;
          local_138.fadexpr_.right_ = (Fad<double> *)local_80;
          local_138.fadexpr_.left_ = &local_70;
          local_80._8_8_ = local_f8;
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                    (&tmp2,(FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                            *)&local_138);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar4,&tmp2);
          Fad<double>::~Fad(&tmp2);
          Fad<double>::~Fad((Fad<double> *)local_f8);
          Fad<double>::~Fad(&local_d8);
          Fad<double>::~Fad(&local_70);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp2,this,local_140,local_140);
        Fad<double>::Fad(&local_50,&tmp2);
        local_b8 = ABS(local_50.val_);
        uStack_b0 = 0;
        Fad<double>::~Fad(&local_50);
        if (local_b8 < 1e-12) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        lVar5 = local_140;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_d8,this,local_140,lVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_f8,this,local_140);
        local_138.fadexpr_.left_ = &local_d8;
        local_138.fadexpr_.right_ = (Fad<double> *)local_f8;
        Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                  (&local_70,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)&local_138);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar4,&local_70);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad((Fad<double> *)local_f8);
        Fad<double>::~Fad(&local_d8);
        lVar5 = local_140;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_70,this,local_140,lVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar4,lVar5,&local_70);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad(&tmp2);
      }
      Fad<double>::~Fad(&tmp);
      local_140 = local_140 + 1;
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}